

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

uint32_t __thiscall Constant::toDot(Constant *this,stringstream *ss)

{
  size_t sVar1;
  ostream *poVar2;
  element_type *peVar3;
  string local_40 [36];
  uint local_1c;
  stringstream *psStack_18;
  uint32_t id;
  stringstream *ss_local;
  Constant *this_local;
  
  psStack_18 = ss;
  ss_local = (stringstream *)this;
  sVar1 = std::hash<Node_*>::operator()((hash<Node_*> *)&Node::hash,(Node *)this);
  local_1c = (uint)sVar1;
  poVar2 = std::operator<<((ostream *)(psStack_18 + 0x10),'\t');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = std::operator<<(poVar2,"[shape=box, label=\"Const\\nval: ");
  peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(this->super_Expr).op);
  (**peVar3->_vptr_Token)();
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2,", fillcolor=\"#f1f8e9\", style=filled]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_40);
  return local_1c;
}

Assistant:

uint32_t toDot(std::stringstream& ss) override {
		uint32_t id = hash(this);
		ss << '\t' << id << ' ' << "[shape=box, label=\"Const\\nval: " << op->toString() << "\"" << ", fillcolor=\"#f1f8e9\", style=filled]" << std::endl;
		return id;
	}